

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall streams_tests::streams_vector_reader::test_method(streams_vector_reader *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  assertion_result *paVar2;
  iterator pvVar3;
  uchar *puVar4;
  int8_t *piVar5;
  uint *puVar6;
  int *piVar7;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  SpanReader *pSVar8;
  char **ppcVar9;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  int d;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  uint c;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  int8_t b;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  uchar a;
  char *local_108;
  char *local_100;
  SpanReader new_reader;
  assertion_result local_e8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  SpanReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  lazy_ostream local_58;
  undefined1 *local_48;
  SpanReader *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._vptr_lazy_ostream =
       (_func_int **)CONCAT26(local_58._vptr_lazy_ostream._6_2_,0x6050403ff01);
  __l._M_len = 6;
  __l._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&vch,__l,(allocator_type *)&local_e8);
  reader.m_data.m_size =
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x87;
  file.m_begin = (iterator)&local_90;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_a8 = "";
  paVar2 = &local_e8;
  local_e8._0_8_ = reader.m_data.m_size;
  new_reader.m_data.m_data = (uchar *)CONCAT44(new_reader.m_data.m_data._4_4_,6);
  pvVar1 = (iterator)0x2;
  pSVar8 = &new_reader;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_58,&local_b0,0x87,1,2,paVar2,"reader.size()",&new_reader,"6U");
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x88;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = (iterator)paVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size != 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  new_reader.m_data.m_data = "!reader.empty()";
  new_reader.m_data.m_size = (long)"!reader.empty()" + 0xf;
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_100 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = &new_reader;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_58,1,0,WARN,(check_type)pSVar8,(size_t)&local_108,0x88);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  a = ser_readdata8<SpanReader>(&reader);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x8d;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_138 = "";
  local_e8._0_4_ = 1;
  pvVar1 = (iterator)0x2;
  puVar4 = &a;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_58,&local_140,0x8d,1,2,puVar4,"a",&local_e8,"1");
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x8e;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = (iterator)puVar4;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_168 = "";
  paVar2 = &local_e8;
  local_e8._0_8_ = reader.m_data.m_size;
  new_reader.m_data.m_data = (uchar *)CONCAT44(new_reader.m_data.m_data._4_4_,5);
  pvVar1 = (iterator)0x2;
  pSVar8 = &new_reader;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_58,&local_170,0x8e,1,2,paVar2,"reader.size()",&new_reader,"5U");
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x8f;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = (iterator)paVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size != 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  new_reader.m_data.m_data = "!reader.empty()";
  new_reader.m_data.m_size = (long)"!reader.empty()" + 0xf;
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_198 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = &new_reader;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_58,1,0,WARN,(check_type)pSVar8,(size_t)&local_1a0,0x8f);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  b = ser_readdata8<SpanReader>(&reader);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x94;
  file_04.m_begin = (iterator)&local_1b8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c8,
             msg_04);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1d0 = "";
  local_e8._0_4_ = 0xffffffff;
  pvVar1 = (iterator)0x2;
  piVar5 = &b;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
            (&local_58,&local_1d8,0x94,1,2,piVar5,"b",&local_e8,"-1");
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x95;
  file_05.m_begin = (iterator)&local_1e8;
  msg_05.m_end = piVar5;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1f8,
             msg_05);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_200 = "";
  paVar2 = &local_e8;
  local_e8._0_8_ = reader.m_data.m_size;
  new_reader.m_data.m_data = (uchar *)CONCAT44(new_reader.m_data.m_data._4_4_,4);
  pvVar1 = (iterator)0x2;
  pSVar8 = &new_reader;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_58,&local_208,0x95,1,2,paVar2,"reader.size()",&new_reader,"4U");
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x96;
  file_06.m_begin = (iterator)&local_218;
  msg_06.m_end = (iterator)paVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_228,
             msg_06);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size != 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  new_reader.m_data.m_data = "!reader.empty()";
  new_reader.m_data.m_size = (long)"!reader.empty()" + 0xf;
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_230 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = &new_reader;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_58,1,0,WARN,(check_type)pSVar8,(size_t)&local_238,0x96);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  c = ser_readdata32<SpanReader>(&reader);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x9b;
  file_07.m_begin = (iterator)&local_250;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_260,
             msg_07);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_268 = "";
  local_e8._0_4_ = 0x6050403;
  pvVar1 = (iterator)0x2;
  puVar6 = &c;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_58,&local_270,0x9b,1,2,puVar6,"c",&local_e8,"100992003U");
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x9c;
  file_08.m_begin = (iterator)&local_280;
  msg_08.m_end = (iterator)puVar6;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_290,
             msg_08);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_298 = "";
  paVar2 = &local_e8;
  local_e8._0_8_ = reader.m_data.m_size;
  new_reader.m_data.m_data = (uchar *)((ulong)new_reader.m_data.m_data & 0xffffffff00000000);
  pvVar1 = (iterator)0x2;
  pSVar8 = &new_reader;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_58,&local_2a0,0x9c,1,2,paVar2,"reader.size()",&new_reader,"0U");
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x9d;
  file_09.m_begin = (iterator)&local_2b0;
  msg_09.m_end = (iterator)paVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2c0,
             msg_09);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  new_reader.m_data.m_data = "reader.empty()";
  new_reader.m_data.m_size = (long)"!reader.empty()" + 0xf;
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2c8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = &new_reader;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_58,1,0,WARN,(check_type)pSVar8,(size_t)&local_2d0,0x9d);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa1;
  file_10.m_begin = (iterator)&local_2e8;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2f8,
             msg_10);
  d = ser_readdata32<SpanReader>(&reader);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xa1;
  file_11.m_begin = (iterator)&local_308;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_318,
             msg_11);
  local_e8._0_8_ = (ulong)(uint7)local_e8._1_7_ << 8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xb66465;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_320 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_58,1,1,WARN,(check_type)pSVar8,(size_t)&local_328,0xa1);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  new_reader.m_data.m_size =
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  new_reader.m_data.m_data =
       vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  d = ser_readdata32<SpanReader>(&new_reader);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xa6;
  file_12.m_begin = (iterator)&local_368;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_378,
             msg_12);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_380 = "";
  local_e8._0_4_ = 0x403ff01;
  pvVar1 = (iterator)0x2;
  piVar7 = &d;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_58,&local_388,0xa6,1,2,piVar7,"d",&local_e8,"67370753");
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xa7;
  file_13.m_begin = (iterator)&local_398;
  msg_13.m_end = (iterator)piVar7;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3a8,
             msg_13);
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xc7f1cc;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3b0 = "";
  paVar2 = &local_e8;
  local_e8._0_8_ = new_reader.m_data.m_size;
  local_3e8 = (char *)CONCAT44(local_3e8._4_4_,2);
  pvVar1 = (iterator)0x2;
  ppcVar9 = &local_3e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_58,&local_3b8,0xa7,1,2,paVar2,"new_reader.size()",&local_3e8,"2U");
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xa8;
  file_14.m_begin = (iterator)&local_3c8;
  msg_14.m_end = (iterator)paVar2;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3d8,
             msg_14);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e8 = "!new_reader.empty()";
  local_3e0 = "";
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3f0 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = (SpanReader *)&local_3e8;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(new_reader.m_data.m_size != 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_58,1,0,WARN,(check_type)ppcVar9,(size_t)&local_3f8,0xa8);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xac;
  file_15.m_begin = (iterator)&local_408;
  msg_15.m_end = pvVar3;
  msg_15.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_418,
             msg_15);
  d = ser_readdata32<SpanReader>(&new_reader);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xac;
  file_16.m_begin = (iterator)&local_428;
  msg_16.m_end = pvVar3;
  msg_16.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_438,
             msg_16);
  local_e8._0_8_ = (ulong)(uint7)local_e8._1_7_ << 8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011482f0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (SpanReader *)0xb66465;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_440 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_58,1,1,WARN,(check_type)ppcVar9,(size_t)&local_448,0xac);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_vector_reader)
{
    std::vector<unsigned char> vch = {1, 255, 3, 4, 5, 6};

    SpanReader reader{vch};
    BOOST_CHECK_EQUAL(reader.size(), 6U);
    BOOST_CHECK(!reader.empty());

    // Read a single byte as an unsigned char.
    unsigned char a;
    reader >> a;
    BOOST_CHECK_EQUAL(a, 1);
    BOOST_CHECK_EQUAL(reader.size(), 5U);
    BOOST_CHECK(!reader.empty());

    // Read a single byte as a int8_t.
    int8_t b;
    reader >> b;
    BOOST_CHECK_EQUAL(b, -1);
    BOOST_CHECK_EQUAL(reader.size(), 4U);
    BOOST_CHECK(!reader.empty());

    // Read a 4 bytes as an unsigned int.
    unsigned int c;
    reader >> c;
    BOOST_CHECK_EQUAL(c, 100992003U); // 3,4,5,6 in little-endian base-256
    BOOST_CHECK_EQUAL(reader.size(), 0U);
    BOOST_CHECK(reader.empty());

    // Reading after end of byte vector throws an error.
    signed int d;
    BOOST_CHECK_THROW(reader >> d, std::ios_base::failure);

    // Read a 4 bytes as a signed int from the beginning of the buffer.
    SpanReader new_reader{vch};
    new_reader >> d;
    BOOST_CHECK_EQUAL(d, 67370753); // 1,255,3,4 in little-endian base-256
    BOOST_CHECK_EQUAL(new_reader.size(), 2U);
    BOOST_CHECK(!new_reader.empty());

    // Reading after end of byte vector throws an error even if the reader is
    // not totally empty.
    BOOST_CHECK_THROW(new_reader >> d, std::ios_base::failure);
}